

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

bool is_modifier(Token *token)

{
  uint uVar1;
  
  uVar1 = token->kind - PUBLIC;
  if ((uVar1 < 0xe) && ((0x2017U >> (uVar1 & 0x1f) & 1) != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

bool is_modifier(Token *token) {
    switch (g_kind(token)) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case STATIC:
        case FINAL:
            return true;
        default:
            return false;
    }
}